

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  ProgramResult *this;
  ulong uVar9;
  uint uVar10;
  undefined1 local_1030 [8];
  ToolOptions options;
  ofstream dst;
  undefined1 local_b80 [8];
  ProgramResult result;
  string local_9f8 [32];
  string local_9d8 [32];
  _Any_data local_9b8;
  code *local_9a8;
  code *local_9a0;
  _Any_data local_998;
  code *local_988;
  code *local_980;
  _Any_data local_978;
  code *local_968;
  code *local_960;
  _Any_data local_958;
  code *local_948;
  code *local_940;
  _Any_data local_938;
  code *local_928;
  code *local_920;
  _Any_data local_918;
  code *local_908;
  code *local_900;
  _Any_data local_8f8;
  code *local_8e8;
  code *local_8e0;
  _Any_data local_8d8;
  code *local_8c8;
  code *local_8c0;
  string local_8b8;
  string local_898;
  _Any_data local_878;
  code *local_868;
  code *local_860;
  _Any_data local_858;
  code *local_848;
  code *local_840;
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8;
  string local_498;
  string local_478;
  string local_458 [32];
  string local_438;
  string local_418;
  undefined1 local_3f8 [32];
  string local_3d8;
  string local_3b8;
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  ModuleIOBase local_298;
  bool bStack_297;
  bool local_296;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cmd;
  string local_230 [8];
  string binDir;
  _Any_data local_1f0;
  code *local_1e0;
  code *local_1d8;
  undefined1 local_1d0 [8];
  string input;
  anon_class_8_1_a7eb7a0b stopIfNotForced;
  undefined1 local_190 [8];
  ProgramResult resultOnValid;
  string command;
  ProgramResult resultOnInvalid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ulong local_d0;
  undefined1 local_c8 [8];
  string test;
  string working;
  string WasmReduceOption;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  uint local_3c;
  bool local_35;
  bool local_34;
  char local_33;
  bool local_32;
  bool local_31 [4];
  bool deNan;
  bool verbose;
  bool force;
  bool debugInfo;
  bool binary;
  
  local_1d0 = (undefined1  [8])&input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  local_c8 = (undefined1  [8])&test._M_string_length;
  test._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  test.field_2._8_8_ = &working._M_string_length;
  working._M_dataplus._M_p = (pointer)0x0;
  resultOnValid.time = (double)&command._M_string_length;
  command._M_dataplus._M_p = (pointer)0x0;
  test._M_string_length._0_1_ = 0;
  working._M_string_length._0_1_ = 0;
  command._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,*argv,(allocator<char> *)local_b80);
  wasm::Path::getDirName(local_230);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  local_31[0] = true;
  local_35 = false;
  local_34 = false;
  local_32 = false;
  local_33 = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(working.field_2._M_local_buf + 8),"wasm-reduce options",
             (allocator<char> *)&options.enabledFeatures);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"wasm-reduce",
             (allocator<char> *)&stack0xfffffffffffffd68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b80,
             "Reduce a wasm file to a smaller one that has the same behavior on a given command",
             (allocator<char> *)(&command.field_2._M_allocated_capacity + 1));
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1030,(string *)&options.enabledFeatures,(string *)local_b80);
  std::__cxx11::string::~string((string *)local_b80);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"--command",&local_5e);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b80,"-cmd",&local_5d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffd68,
             "The command to run on the test, that we want to reduce while keeping the command\'s output identical. We look at the command\'s return code and stdout here (TODO: stderr), and we reduce while keeping those unchanged."
             ,&local_5c);
  resultOnInvalid.code = 0;
  resultOnInvalid._4_4_ = 0;
  command.field_2._8_8_ = &resultOnValid.time;
  resultOnInvalid.output._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1207:10)>
       ::_M_invoke;
  resultOnInvalid.output._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1207:10)>
                ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add((string *)local_1030,(string *)&options.enabledFeatures,
                              (string *)local_b80,(string *)&stack0xfffffffffffffd68,
                              (int)&working + 0x18,(function *)0x1,
                              SUB81((allocator<char> *)(&command.field_2._M_allocated_capacity + 1),
                                    0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_190,"--test",&local_5b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&resultOnInvalid.time,"-t",&local_5a)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "Test file (this will be written to to test, the given command should read it when we call it)"
             ,&local_59);
  local_1f0._8_8_ = 0;
  local_1f0._M_unused._M_object = local_c8;
  local_1d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1214:10)>
              ::_M_invoke;
  local_1e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1214:10)>
              ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add(psVar3,(string *)local_190,(string *)&resultOnInvalid.time,
                              (string *)&local_f0,(int)&working + 0x18,(function *)0x1,
                              SUB81(&local_1f0,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input.field_2._M_local_buf + 8),"--working",&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(binDir.field_2._M_local_buf + 8),"-w",&local_57);
  std::__cxx11::string::string<std::allocator<char>>
            (local_838,
             "Working file (this will contain the current good state while doing temporary computations, and will contain the final best result at the end)"
             ,&local_56);
  local_9b8._8_8_ = 0;
  local_9b8._M_unused._0_8_ = (undefined8)((long)&test.field_2 + 8);
  local_9a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1222:10)>
              ::_M_invoke;
  local_9a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1222:10)>
              ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add(psVar3,(string *)(input.field_2._M_local_buf + 8),
                              (string *)(binDir.field_2._M_local_buf + 8),local_838,
                              (int)&working + 0x18,(function *)0x1,SUB81(&local_9b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_818,"--binaries",&local_55);
  std::__cxx11::string::string<std::allocator<char>>(local_7f8,"-b",&local_54);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7d8,"binaryen binaries location (bin/ directory)",&local_53);
  local_998._8_8_ = 0;
  local_980 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1228:10)>
              ::_M_invoke;
  local_988 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1228:10)>
              ::_M_manager;
  local_998._M_unused._0_8_ = (undefined8)local_230;
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_818,local_7f8,local_7d8,(int)&working + 0x18,
                              (function *)0x1,SUB81(&local_998,0));
  std::__cxx11::string::string<std::allocator<char>>(local_7b8,"--text",&local_52);
  std::__cxx11::string::string<std::allocator<char>>(local_798,"-S",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            (local_778,
             "Emit intermediate files as text, instead of binary (also make sure the test and working files have a .wat or .wast suffix)"
             ,&local_50);
  local_978._8_8_ = 0;
  local_978._M_unused._M_object = local_31;
  local_960 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1238:10)>
              ::_M_invoke;
  local_968 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1238:10)>
              ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_7b8,local_798,local_778,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_978,0));
  std::__cxx11::string::string<std::allocator<char>>(local_758,"--denan",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>(local_738,"",&local_4e);
  std::__cxx11::string::string<std::allocator<char>>(local_718,"Avoid nans when reducing",&local_4d)
  ;
  local_958._8_8_ = 0;
  local_958._M_unused._M_object = &local_35;
  local_940 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1244:10)>
              ::_M_invoke;
  local_948 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1244:10)>
              ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_758,local_738,local_718,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_958,0));
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"--verbose",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_6d8,"-v",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"Verbose output mode",&local_4a);
  local_938._8_8_ = 0;
  local_938._M_unused._M_object = &local_34;
  local_920 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1250:10)>
              ::_M_invoke;
  local_928 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1250:10)>
              ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_6f8,local_6d8,local_6b8,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_938,0));
  std::__cxx11::string::string<std::allocator<char>>(local_698,"--debugInfo",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_678,"-g",&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"Keep debug info in binaries",&local_47);
  local_918._8_8_ = 0;
  local_918._M_unused._M_object = &local_32;
  local_900 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1256:10)>
              ::_M_invoke;
  local_908 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1256:10)>
              ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_698,local_678,local_658,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_918,0));
  std::__cxx11::string::string<std::allocator<char>>(local_638,"--force",&local_46);
  std::__cxx11::string::string<std::allocator<char>>(local_618,"-f",&local_45);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,
             "Force the reduction attempt, ignoring problems that imply it is unlikely to succeed",
             &local_44);
  local_8f8._8_8_ = 0;
  local_8e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1263:10)>
              ::_M_invoke;
  local_8e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1263:10)>
              ::_M_manager;
  local_8f8._M_unused._M_object = &local_33;
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_638,local_618,local_5f8,(int)&working + 0x18,
                              (function *)0x0,SUB81(&local_8f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"--timeout",&local_43);
  std::__cxx11::string::string<std::allocator<char>>(local_5b8,"-to",&local_42);
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,
             "A timeout to apply to each execution of the command, in seconds (default: 2)",
             &local_41);
  local_878._M_unused._M_object = (void *)0x0;
  local_878._8_8_ = 0;
  local_860 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1270:10)>
              ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1270:10)>
              ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_5d8,local_5b8,local_598,(int)&working + 0x18,
                              (function *)0x1,SUB81(&local_878,0));
  std::__cxx11::string::string<std::allocator<char>>(local_578,"--extra-flags",&local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_558,"-ef",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,
             "Extra commandline flags to pass to wasm-opt while reducing. (default: --enable-all)",
             &local_3e);
  local_858._M_unused._M_object = (void *)0x0;
  local_858._8_8_ = 0;
  local_840 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1280:10)>
              ::_M_invoke;
  local_848 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1280:10)>
              ::_M_manager;
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_578,local_558,local_538,(int)&working + 0x18,
                              (function *)0x1,SUB81(&local_858,0));
  std::__cxx11::string::string<std::allocator<char>>(local_518,"INFILE",&local_3d);
  local_8d8._8_8_ = 0;
  local_8d8._M_unused._M_object = local_1d0;
  local_8c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1287:7)>
              ::_M_invoke;
  local_8c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1287:7)>
              ::_M_manager;
  wasm::Options::add_positional(psVar3,(Arguments)local_518,(function *)0x1);
  std::_Function_base::~_Function_base((_Function_base *)&local_8d8);
  std::__cxx11::string::~string(local_518);
  std::_Function_base::~_Function_base((_Function_base *)&local_858);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_578);
  std::_Function_base::~_Function_base((_Function_base *)&local_878);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_5d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_8f8);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_638);
  std::_Function_base::~_Function_base((_Function_base *)&local_918);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_698);
  std::_Function_base::~_Function_base((_Function_base *)&local_938);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string(local_6f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_958);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_758);
  std::_Function_base::~_Function_base((_Function_base *)&local_978);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_7b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_998);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_818);
  std::_Function_base::~_Function_base((_Function_base *)&local_9b8);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string((string *)(binDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&resultOnInvalid.time);
  std::__cxx11::string::~string((string *)local_190);
  std::_Function_base::~_Function_base((_Function_base *)((long)&command.field_2 + 8));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
  std::__cxx11::string::~string((string *)local_b80);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  wasm::Options::parse((int)local_1030,(char **)(ulong)(uint)argc);
  if (local_32 == true) {
    std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  }
  iVar2 = wasm::getTypeSystem();
  if ((iVar2 != 1) && (iVar2 = wasm::getTypeSystem(), iVar2 != 0)) {
    wasm::handle_unreachable
              ("unexpected type system",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
               ,0x512);
  }
  std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  if (test._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [24])"test file not provided\n");
  }
  else {
    if (working._M_dataplus._M_p != (pointer)0x0) {
      if (local_31[0] == false) {
        Colors::setEnabled(false);
      }
      wasm::Path::setBinaryenBinDir(local_230);
      std::operator<<((ostream *)&std::cerr,"|wasm-reduce\n");
      poVar4 = std::operator<<((ostream *)&std::cerr,"|input: ");
      poVar4 = std::operator<<(poVar4,(string *)local_1d0);
      std::operator<<(poVar4,'\n');
      poVar4 = std::operator<<((ostream *)&std::cerr,"|test: ");
      poVar4 = std::operator<<(poVar4,(string *)local_c8);
      std::operator<<(poVar4,'\n');
      poVar4 = std::operator<<((ostream *)&std::cerr,"|working: ");
      poVar4 = std::operator<<(poVar4,(string *)(test.field_2._M_local_buf + 8));
      std::operator<<(poVar4,'\n');
      poVar4 = std::operator<<((ostream *)&std::cerr,"|bin dir: ");
      poVar4 = std::operator<<(poVar4,local_230);
      std::operator<<(poVar4,'\n');
      poVar4 = std::operator<<((ostream *)&std::cerr,"|extra flags: ");
      poVar4 = std::operator<<(poVar4,(string *)&extraFlags_abi_cxx11_);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::string(local_4f8,(string *)local_1d0);
      std::__cxx11::string::string(local_4d8,(string *)local_c8);
      wasm::copy_file(local_4f8,local_4d8);
      std::__cxx11::string::~string(local_4d8);
      std::__cxx11::string::~string(local_4f8);
      std::__cxx11::string::string((string *)&local_4b8,(string *)&resultOnValid.time);
      ProgramResult::getFromExecution(&expected,&local_4b8);
      std::__cxx11::string::~string((string *)&local_4b8);
      poVar4 = std::operator<<((ostream *)&std::cerr,"|expected result:\n");
      ProgramResult::dump(&expected,poVar4);
      std::operator<<(poVar4,'\n');
      std::operator<<((ostream *)&std::cerr,"|!! Make sure the above is what you expect! !!\n\n");
      input.field_2._8_8_ = &local_33;
      if (((double)CONCAT44(0x45300000,(int)(timeout >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)timeout) - 4503599627370496.0) <= expected.time + 1.0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_498,
                   "execution time is dangerously close to the timeout - you should probably increase the timeout"
                   ,(allocator<char> *)&options.enabledFeatures);
        main::anon_class_8_1_a7eb7a0b::operator()
                  ((anon_class_8_1_a7eb7a0b *)((long)&input.field_2 + 8),&local_498,&expected);
        std::__cxx11::string::~string((string *)&local_498);
      }
      if (local_33 == '\0') {
        std::operator<<((ostream *)&std::cerr,
                        "|checking that command has different behavior on different inputs (this verifies that the test file is used by the command)\n"
                       );
        std::ofstream::ofstream(&options.enabledFeatures,(string *)local_c8,_S_bin);
        std::operator<<((ostream *)&options.enabledFeatures,"waka waka\n");
        std::ofstream::~ofstream(&options.enabledFeatures);
        std::__cxx11::string::string((string *)&local_478,(string *)&resultOnValid.time);
        ProgramResult::ProgramResult((ProgramResult *)((long)&command.field_2 + 8),&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        bVar1 = ProgramResult::operator==((ProgramResult *)((long)&command.field_2 + 8),&expected);
        if (bVar1) {
          wasm::Module::Module((Module *)&options.enabledFeatures);
          cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
          local_296 = false;
          cmd._M_string_length = 0;
          cmd.field_2._M_local_buf[0] = '\0';
          local_298.debugInfo = false;
          bStack_297 = true;
          std::__cxx11::string::string(local_458,(string *)local_c8);
          wasm::ModuleWriter::write(&stack0xfffffffffffffd68,&options.enabledFeatures,local_458);
          std::__cxx11::string::~string(local_458);
          std::__cxx11::string::string((string *)&local_438,(string *)&resultOnValid.time);
          ProgramResult::ProgramResult((ProgramResult *)local_190,&local_438);
          std::__cxx11::string::~string((string *)&local_438);
          bVar1 = ProgramResult::operator==((ProgramResult *)local_190,&expected);
          if (bVar1) {
            wasm::Fatal::Fatal((Fatal *)local_b80);
            std::operator+(&local_f0,
                           "running the command on the given input gives the same result as when running it on either a trivial valid wasm or a file with nonsense in it. does the script not look at the test file ("
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &resultOnInvalid.time,&local_f0,")? (use -f to ignore this check)");
            wasm::Fatal::operator<<
                      ((Fatal *)local_b80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &resultOnInvalid.time);
            std::__cxx11::string::~string((string *)&resultOnInvalid.time);
            std::__cxx11::string::~string((string *)&local_f0);
            wasm::Fatal::~Fatal((Fatal *)local_b80);
          }
          std::__cxx11::string::~string((string *)&resultOnValid);
          wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)&stack0xfffffffffffffd68);
          wasm::Module::~Module((Module *)&options.enabledFeatures);
        }
        std::__cxx11::string::~string((string *)&resultOnInvalid);
      }
      std::operator<<((ostream *)&std::cerr,
                      "|checking that command has expected behavior on canonicalized (read-written) binary\n"
                     );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f0._M_pod_data,"wasm-opt",
                 (allocator<char> *)(binDir.field_2._M_local_buf + 8));
      wasm::Path::getBinaryenBinaryTool((string *)&local_f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &resultOnInvalid.time,&local_f0," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &resultOnInvalid.time,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&command.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     " -o ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&command.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &options.enabledFeatures,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b80,
                     " ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffd68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &options.enabledFeatures,&extraFlags_abi_cxx11_);
      std::__cxx11::string::~string((string *)&options.enabledFeatures);
      std::__cxx11::string::~string((string *)local_b80);
      std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::string::~string((string *)&resultOnInvalid.time);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)local_1f0._M_pod_data);
      if (local_31[0] == false) {
        std::__cxx11::string::append(&stack0xfffffffffffffd68.debugInfo);
      }
      std::__cxx11::string::string((string *)&local_418,(string *)&stack0xfffffffffffffd68);
      ProgramResult::ProgramResult((ProgramResult *)&options.enabledFeatures,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      if (options.enabledFeatures.features == 0) {
        std::__cxx11::string::string((string *)(local_3f8 + 0x20),(string *)&resultOnValid.time);
        ProgramResult::ProgramResult((ProgramResult *)local_b80,(string *)(local_3f8 + 0x20));
        std::__cxx11::string::~string((string *)(local_3f8 + 0x20));
        bVar1 = ProgramResult::operator!=((ProgramResult *)local_b80,&expected);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8,
                     "running command on the canonicalized module should give the same results",
                     (allocator<char> *)(command.field_2._M_local_buf + 8));
          main::anon_class_8_1_a7eb7a0b::operator()
                    ((anon_class_8_1_a7eb7a0b *)((long)&input.field_2 + 8),&local_3b8,
                     (ProgramResult *)local_b80);
          std::__cxx11::string::~string((string *)&local_3b8);
        }
        this = &result;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3f8,"failed to read and write the binary",
                   (allocator<char> *)local_b80);
        main::anon_class_8_1_a7eb7a0b::operator()
                  ((anon_class_8_1_a7eb7a0b *)((long)&input.field_2 + 8),(string *)local_3f8,
                   (ProgramResult *)&options.enabledFeatures);
        this = (ProgramResult *)local_3f8;
      }
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::string::~string((string *)&dst);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
      std::__cxx11::string::string(local_398,(string *)local_1d0);
      std::__cxx11::string::string(local_378,(string *)(test.field_2._M_local_buf + 8));
      wasm::copy_file(local_398,local_378);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::string(local_358,(string *)(test.field_2._M_local_buf + 8));
      uVar5 = wasm::file_size(local_358);
      std::__cxx11::string::~string(local_358);
      poVar4 = std::operator<<((ostream *)&std::cerr,"|input size: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"\n");
      std::operator<<((ostream *)&std::cerr,"|starting reduction!\n");
      if (local_31[0] == true) {
        uVar5 = uVar5 * 2;
      }
      else {
        uVar5 = uVar5 / 10;
      }
      local_d0 = 0;
      WasmReduceOption.field_2._8_8_ = 0;
      sVar8 = 0;
      do {
        std::__cxx11::string::string((string *)&local_338,(string *)&resultOnValid.time);
        std::__cxx11::string::string((string *)&local_8b8,(string *)local_c8);
        std::__cxx11::string::string((string *)&local_898,(string *)(test.field_2._M_local_buf + 8))
        ;
        Reducer::Reducer((Reducer *)&options.enabledFeatures,&local_338,&local_8b8,&local_898,
                         local_31[0],local_35,local_34,local_32,(ToolOptions *)local_1030);
        std::__cxx11::string::~string((string *)&local_898);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::__cxx11::string::~string((string *)&local_338);
        std::operator<<((ostream *)&std::cerr,"|  reduce using passes...\n");
        std::__cxx11::string::string(local_9f8,(string *)(test.field_2._M_local_buf + 8));
        lVar6 = wasm::file_size(local_9f8);
        std::__cxx11::string::~string(local_9f8);
        Reducer::reduceUsingPasses((Reducer *)&options.enabledFeatures);
        std::__cxx11::string::string(local_9d8,(string *)(test.field_2._M_local_buf + 8));
        uVar7 = wasm::file_size(local_9d8);
        std::__cxx11::string::~string(local_9d8);
        poVar4 = std::operator<<((ostream *)&std::cerr,"|  after pass reduction: ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"\n");
        local_3c = (uint)CONCAT71((int7)((ulong)poVar4 >> 8),1);
        if ((WasmReduceOption.field_2._8_8_ & 1) == 0) {
          if (local_d0 - 1 < uVar7) {
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     "|  progress has stopped, skipping to the end\n");
            local_3c = (uint)CONCAT71((int7)((ulong)poVar4 >> 8),1);
            uVar9 = 1;
            if ((int)uVar5 != 1) {
              uVar9 = (long)((int)uVar5 + 1) / 2 & 0xffffffff;
              local_3c = 0;
            }
          }
          else {
            local_3c = 0;
            uVar9 = uVar5 & 0xffffffff;
          }
          poVar4 = std::operator<<((ostream *)&std::cerr,"|  pass progress: ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,", last destructive: ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4,'\n');
          iVar2 = (int)uVar9;
          if (lVar6 - uVar7 < sVar8 << 2) {
            if (iVar2 < 0xb) {
              uVar10 = (iVar2 + 1) / 2;
            }
            else {
              uVar10 = (int)(uVar9 / 3) + 1;
            }
          }
          else {
            std::operator<<((ostream *)&std::cerr,
                            "|  progress is good, do not quickly decrease factor\n");
            uVar10 = (iVar2 * 9) / 10;
            if ((int)uVar10 < 2) {
              uVar10 = 1;
            }
          }
          if (uVar7 < 5) {
            __assert_fail("newSize > 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
                          ,0x5b4,"int main(int, const char **)");
          }
          uVar9 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / 4;
          uVar5 = (ulong)uVar10;
          if ((int)uVar9 < (int)uVar10) {
            uVar5 = uVar9 & 0xffffffff;
          }
          while( true ) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"|  reduce destructively... (factor: ");
            iVar2 = (int)uVar5;
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
            std::operator<<(poVar4,")\n");
            sVar8 = Reducer::reduceDestructively((Reducer *)&options.enabledFeatures,iVar2);
            if (sVar8 != 0) break;
            if (iVar2 == 1) {
              local_3c = 1;
              uVar5 = 1;
              break;
            }
            uVar5 = (long)iVar2 / 4;
            if ((int)((long)iVar2 / 4) < 2) {
              uVar5 = 1;
            }
            uVar5 = uVar5 & 0xffffffff;
          }
          poVar4 = std::operator<<((ostream *)&std::cerr,"|  destructive reduction led to size: ");
          std::__cxx11::string::string(local_318,(string *)(test.field_2._M_local_buf + 8));
          wasm::file_size(local_318);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4,'\n');
          std::__cxx11::string::~string(local_318);
          local_d0 = uVar7;
        }
        Reducer::~Reducer((Reducer *)&options.enabledFeatures);
        uVar7 = WasmReduceOption.field_2._8_8_ & 1;
        WasmReduceOption.field_2._8_8_ = ZEXT48(local_3c);
        if (uVar7 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"|finished, final size: ");
          std::__cxx11::string::string(local_2f8,(string *)(test.field_2._M_local_buf + 8));
          wasm::file_size(local_2f8);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4,"\n");
          std::__cxx11::string::~string(local_2f8);
          std::__cxx11::string::string(local_2d8,(string *)(test.field_2._M_local_buf + 8));
          std::__cxx11::string::string(local_2b8,(string *)local_c8);
          wasm::copy_file(local_2d8,local_2b8);
          std::__cxx11::string::~string(local_2b8);
          std::__cxx11::string::~string(local_2d8);
          wasm::ToolOptions::~ToolOptions((ToolOptions *)local_1030);
          std::__cxx11::string::~string((string *)(working.field_2._M_local_buf + 8));
          std::__cxx11::string::~string(local_230);
          std::__cxx11::string::~string((string *)&resultOnValid.time);
          std::__cxx11::string::~string((string *)(test.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_c8);
          std::__cxx11::string::~string((string *)local_1d0);
          return 0;
        }
      } while( true );
    }
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [27])"working file not provided\n");
  }
  wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string input, test, working, command;
  // By default, look for binaries alongside our own binary.
  std::string binDir = Path::getDirName(argv[0]);
  bool binary = true, deNan = false, verbose = false, debugInfo = false,
       force = false;

  const std::string WasmReduceOption = "wasm-reduce options";

  ToolOptions options("wasm-reduce",
                      "Reduce a wasm file to a smaller one that has the same "
                      "behavior on a given command");
  options
    .add("--command",
         "-cmd",
         "The command to run on the test, that we want to reduce while keeping "
         "the command's output identical. "
         "We look at the command's return code and stdout here (TODO: stderr), "
         "and we reduce while keeping those unchanged.",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { command = argument; })
    .add("--test",
         "-t",
         "Test file (this will be written to to test, the given command should "
         "read it when we call it)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { test = argument; })
    .add("--working",
         "-w",
         "Working file (this will contain the current good state while doing "
         "temporary computations, "
         "and will contain the final best result at the end)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { working = argument; })
    .add("--binaries",
         "-b",
         "binaryen binaries location (bin/ directory)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           // Add separator just in case
           binDir = argument + Path::getPathSeparator();
         })
    .add("--text",
         "-S",
         "Emit intermediate files as text, instead of binary (also make sure "
         "the test and working files have a .wat or .wast suffix)",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { binary = false; })
    .add("--denan",
         "",
         "Avoid nans when reducing",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { deNan = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { verbose = true; })
    .add("--debugInfo",
         "-g",
         "Keep debug info in binaries",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { debugInfo = true; })
    .add("--force",
         "-f",
         "Force the reduction attempt, ignoring problems that imply it is "
         "unlikely to succeed",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { force = true; })
    .add("--timeout",
         "-to",
         "A timeout to apply to each execution of the command, in seconds "
         "(default: 2)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           timeout = atoi(argument.c_str());
           std::cout << "|applying timeout: " << timeout << "\n";
         })
    .add("--extra-flags",
         "-ef",
         "Extra commandline flags to pass to wasm-opt while reducing. "
         "(default: --enable-all)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           extraFlags = argument;
           std::cout << "|applying extraFlags: " << extraFlags << "\n";
         })
    .add_positional(
      "INFILE",
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { input = argument; });
  options.parse(argc, argv);

  if (debugInfo) {
    extraFlags += " -g ";
  }
  if (getTypeSystem() == TypeSystem::Nominal) {
    extraFlags += " --nominal";
  } else if (getTypeSystem() == TypeSystem::Isorecursive) {
    extraFlags += " --hybrid";
  } else {
    WASM_UNREACHABLE("unexpected type system");
  }

  if (test.size() == 0) {
    Fatal() << "test file not provided\n";
  }
  if (working.size() == 0) {
    Fatal() << "working file not provided\n";
  }

  if (!binary) {
    Colors::setEnabled(false);
  }

  Path::setBinaryenBinDir(binDir);

  std::cerr << "|wasm-reduce\n";
  std::cerr << "|input: " << input << '\n';
  std::cerr << "|test: " << test << '\n';
  std::cerr << "|working: " << working << '\n';
  std::cerr << "|bin dir: " << binDir << '\n';
  std::cerr << "|extra flags: " << extraFlags << '\n';

  // get the expected output
  copy_file(input, test);
  expected.getFromExecution(command);

  std::cerr << "|expected result:\n" << expected << '\n';
  std::cerr << "|!! Make sure the above is what you expect! !!\n\n";

  auto stopIfNotForced = [&](std::string message, ProgramResult& result) {
    std::cerr << "|! " << message << '\n' << result << '\n';
    if (!force) {
      Fatal() << "|! stopping, as it is very unlikely reduction can succeed "
                 "(use -f to ignore this check)";
    }
  };

  if (expected.time + 1 >= timeout) {
    stopIfNotForced("execution time is dangerously close to the timeout - you "
                    "should probably increase the timeout",
                    expected);
  }

  if (!force) {
    std::cerr << "|checking that command has different behavior on different "
                 "inputs (this "
                 "verifies that the test file is used by the command)\n";
    // Try it on an invalid input.
    {
      std::ofstream dst(test, std::ios::binary);
      dst << "waka waka\n";
    }
    ProgramResult resultOnInvalid(command);
    if (resultOnInvalid == expected) {
      // Try it on a valid input.
      Module emptyModule;
      ModuleWriter writer;
      writer.setBinary(true);
      writer.write(emptyModule, test);
      ProgramResult resultOnValid(command);
      if (resultOnValid == expected) {
        Fatal()
          << "running the command on the given input gives the same result as "
             "when running it on either a trivial valid wasm or a file with "
             "nonsense in it. does the script not look at the test file (" +
               test + ")? (use -f to ignore this check)";
      }
    }
  }

  std::cerr << "|checking that command has expected behavior on canonicalized "
               "(read-written) binary\n";
  {
    // read and write it
    auto cmd = Path::getBinaryenBinaryTool("wasm-opt") + " " + input + " -o " +
               test + " " + extraFlags;
    if (!binary) {
      cmd += " -S ";
    }
    ProgramResult readWrite(cmd);
    if (readWrite.failed()) {
      stopIfNotForced("failed to read and write the binary", readWrite);
    } else {
      ProgramResult result(command);
      if (result != expected) {
        stopIfNotForced("running command on the canonicalized module should "
                        "give the same results",
                        result);
      }
    }
  }

  copy_file(input, working);
  auto workingSize = file_size(working);
  std::cerr << "|input size: " << workingSize << "\n";

  std::cerr << "|starting reduction!\n";

  int factor = binary ? workingSize * 2 : workingSize / 10;

  size_t lastDestructiveReductions = 0;
  size_t lastPostPassesSize = 0;

  bool stopping = false;

  while (1) {
    Reducer reducer(
      command, test, working, binary, deNan, verbose, debugInfo, options);

    // run binaryen optimization passes to reduce. passes are fast to run
    // and can often reduce large amounts of code efficiently, as opposed
    // to detructive reduction (i.e., that doesn't preserve correctness as
    // passes do) since destrucive must operate one change at a time
    std::cerr << "|  reduce using passes...\n";
    auto oldSize = file_size(working);
    reducer.reduceUsingPasses();
    auto newSize = file_size(working);
    auto passProgress = oldSize - newSize;
    std::cerr << "|  after pass reduction: " << newSize << "\n";

    // always stop after a pass reduction attempt, for final cleanup
    if (stopping) {
      break;
    }

    // check if the full cycle (destructive/passes) has helped or not
    if (lastPostPassesSize && newSize >= lastPostPassesSize) {
      std::cerr << "|  progress has stopped, skipping to the end\n";
      if (factor == 1) {
        // this is after doing work with factor 1, so after the remaining work,
        // stop
        stopping = true;
      } else {
        // decrease the factor quickly
        factor = (factor + 1) / 2; // stable on 1
      }
    }
    lastPostPassesSize = newSize;

    // If destructive reductions lead to useful proportionate pass reductions,
    // keep going at the same factor, as pass reductions are far faster.
    std::cerr << "|  pass progress: " << passProgress
              << ", last destructive: " << lastDestructiveReductions << '\n';
    if (passProgress >= 4 * lastDestructiveReductions) {
      std::cerr << "|  progress is good, do not quickly decrease factor\n";
      // While the amount of pass reductions is proportionately high, we do
      // still want to reduce the factor by some amount. If we do not then there
      // is a risk that both pass and destructive reductions are very low, and
      // we get "stuck" cycling through them. In that case we simply need to do
      // more destructive reductions to make real progress. For that reason,
      // decrease the factor by some small percentage.
      factor = std::max(1, (factor * 9) / 10);
    } else {
      if (factor > 10) {
        factor = (factor / 3) + 1;
      } else {
        factor = (factor + 1) / 2; // stable on 1
      }
    }

    // no point in a factor lorger than the size
    assert(newSize > 4); // wasm modules are >4 bytes anyhow
    factor = std::min(factor, int(newSize) / 4);

    // try to reduce destructively. if a high factor fails to find anything,
    // quickly try a lower one (no point in doing passes until we reduce
    // destructively at least a little)
    while (1) {
      std::cerr << "|  reduce destructively... (factor: " << factor << ")\n";
      lastDestructiveReductions = reducer.reduceDestructively(factor);
      if (lastDestructiveReductions > 0) {
        break;
      }
      // we failed to reduce destructively
      if (factor == 1) {
        stopping = true;
        break;
      }
      factor = std::max(
        1, factor / 4); // quickly now, try to find *something* we can reduce
    }

    std::cerr << "|  destructive reduction led to size: " << file_size(working)
              << '\n';
  }
  std::cerr << "|finished, final size: " << file_size(working) << "\n";
  copy_file(working, test); // just to avoid confusion
}